

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O0

void trt_pose::parse::find_peaks_out_hw
               (int *counts,int *peaks,float *input,int H,int W,int M,float threshold,
               int window_size)

{
  bool bVar1;
  int iVar2;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_60;
  int local_5c;
  int jj;
  int ii;
  bool is_peak;
  int jj_max;
  int ii_max;
  int jj_min;
  int ii_min;
  float val;
  int j;
  int i;
  int count;
  int win;
  float threshold_local;
  int M_local;
  int W_local;
  int H_local;
  float *input_local;
  int *peaks_local;
  int *counts_local;
  
  iVar2 = window_size / 2;
  j = 0;
  for (val = 0.0; (int)val < H && j < M; val = (float)((int)val + 1)) {
    for (ii_min = 0; ii_min < W && j < M; ii_min = ii_min + 1) {
      if (threshold <= input[(int)val * W + ii_min]) {
        if ((int)val - iVar2 < 1) {
          local_68 = 0;
        }
        else {
          local_68 = (int)val - iVar2;
        }
        if (ii_min - iVar2 < 1) {
          local_6c = 0;
        }
        else {
          local_6c = ii_min - iVar2;
        }
        local_70 = H;
        if ((int)val + iVar2 + 1 < H) {
          local_70 = (int)val + iVar2 + 1;
        }
        local_74 = W;
        if (ii_min + iVar2 + 1 < W) {
          local_74 = ii_min + iVar2 + 1;
        }
        bVar1 = true;
        for (local_5c = local_68; local_5c < local_70; local_5c = local_5c + 1) {
          for (local_60 = local_6c; local_60 < local_74; local_60 = local_60 + 1) {
            if (input[(int)val * W + ii_min] < input[local_5c * W + local_60]) {
              bVar1 = false;
            }
          }
        }
        if (bVar1) {
          peaks[j << 1] = (int)val;
          peaks[j * 2 + 1] = ii_min;
          j = j + 1;
        }
      }
    }
  }
  *counts = j;
  return;
}

Assistant:

void find_peaks_out_hw(int *counts,        // 1
                       int *peaks,         // Mx2
                       const float *input, // HxW
                       const int H, const int W, const int M,
                       const float threshold, const int window_size) {
  int win = window_size / 2;
  int count = 0;

  for (int i = 0; i < H && count < M; i++) {
    for (int j = 0; j < W && count < M; j++) {
      float val = input[i * W + j];

      // skip if below threshold
      if (val < threshold)
        continue;

      // compute window bounds
      int ii_min = MAX(i - win, 0);
      int jj_min = MAX(j - win, 0);
      int ii_max = MIN(i + win + 1, H);
      int jj_max = MIN(j + win + 1, W);

      // search for larger value in window
      bool is_peak = true;
      for (int ii = ii_min; ii < ii_max; ii++) {
        for (int jj = jj_min; jj < jj_max; jj++) {
          if (input[ii * W + jj] > val) {
            is_peak = false;
          }
        }
      }

      // add peak
      if (is_peak) {
        peaks[count * 2] = i;
        peaks[count * 2 + 1] = j;
        count++;
      }
    }
  }

  *counts = count;
}